

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void __thiscall
DoubleEscaper::Modify
          (DoubleEscaper *this,char *in,size_t inlen,PerExpandData *data,ExpandEmitter *outbuf,
          string *arg)

{
  ulong uVar1;
  PerExpandData *pPVar2;
  allocator local_b1;
  string local_b0 [55];
  allocator local_79;
  string local_78 [32];
  TemplateModifier local_58 [8];
  string tmp;
  string *arg_local;
  ExpandEmitter *outbuf_local;
  PerExpandData *data_local;
  size_t inlen_local;
  char *in_local;
  DoubleEscaper *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __assert_fail("arg.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                  ,99,
                  "virtual void DoubleEscaper::Modify(const char *, size_t, const PerExpandData *, ExpandEmitter *, const string &) const"
                 );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  ctemplate::TemplateModifier::operator()
            (local_58,(char *)&ctemplate::javascript_escape,(size_t)in,(string *)inlen);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  uVar1 = std::__cxx11::string::data();
  pPVar2 = (PerExpandData *)std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"",&local_b1);
  ctemplate::HtmlEscape::Modify
            ((char *)&ctemplate::html_escape,uVar1,pPVar2,(ExpandEmitter *)data,(string *)outbuf);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void Modify(const char* in, size_t inlen,
              const PerExpandData* data,
              ExpandEmitter* outbuf, const string& arg) const {
    assert(arg.empty());    // we don't take an argument
    string tmp = GOOGLE_NAMESPACE::javascript_escape(in, inlen);
    GOOGLE_NAMESPACE::html_escape.Modify(tmp.data(), tmp.size(), data, outbuf, "");
  }